

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall State::handle(State *this,Event *event)

{
  mapped_type *pmVar1;
  InputEvent local_38;
  
  switch(event->type) {
  case Connected:
    pmVar1 = std::
             map<int,_State::ClientData,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
             ::operator[](&this->clients,&event->clientId);
    std::__cxx11::string::_M_assign((string *)&pmVar1->ip);
    return;
  case Disconnected:
    std::
    _Rb_tree<int,_std::pair<const_int,_State::ClientData>,_std::_Select1st<std::pair<const_int,_State::ClientData>_>,_std::less<int>,_std::allocator<std::pair<const_int,_State::ClientData>_>_>
    ::erase(&(this->clients)._M_t,&event->clientId);
    return;
  case MouseMove:
    if (event->clientId != this->curIdControl) {
      return;
    }
    local_38.type = EMousePos;
    local_38.isDown = false;
    local_38.key = 0x285;
    local_38.mouseButton = -1;
    goto LAB_00106f7a;
  case MouseDown:
    if (event->clientId != this->curIdControl) {
      return;
    }
    local_38.mouseButton = event->mouse_but;
    if (local_38.mouseButton == 2) {
      local_38.mouseButton = 1;
    }
    else if (local_38.mouseButton == 1) {
      local_38.mouseButton = 2;
    }
    local_38.isDown = true;
    break;
  case MouseUp:
    if (event->clientId != this->curIdControl) {
      return;
    }
    local_38.mouseButton = event->mouse_but;
    if (local_38.mouseButton == 2) {
      local_38.mouseButton = 1;
    }
    else if (local_38.mouseButton == 1) {
      local_38.mouseButton = 2;
    }
    local_38.isDown = false;
    break;
  case MouseWheel:
    if (event->clientId != this->curIdControl) {
      return;
    }
    local_38.type = EMouseWheel;
    local_38.isDown = false;
    local_38.key = 0x285;
    local_38.mouseButton = -1;
    local_38.mousePos.x = 0.0;
    local_38.mousePos.y = 0.0;
    local_38.mouseWheelX = event->wheel_x;
    local_38.mouseWheelY = event->wheel_y;
    goto LAB_00106f84;
  case KeyPress:
    if (event->clientId != this->curIdControl) {
      return;
    }
    std::__cxx11::string::resize((ulong)&this->lastAddText);
    *(this->lastAddText)._M_dataplus._M_p = (char)event->key;
    return;
  case KeyDown:
    if (event->clientId != this->curIdControl) {
      return;
    }
    if (event->key < 1) {
      return;
    }
    local_38.key = toImGuiKey(event->key);
    local_38.isDown = true;
    goto LAB_00106f1d;
  case KeyUp:
    if (event->clientId != this->curIdControl) {
      return;
    }
    if (event->key < 1) {
      return;
    }
    local_38.key = toImGuiKey(event->key);
    local_38.isDown = false;
LAB_00106f1d:
    local_38.type = EKey;
    local_38.mouseButton = -1;
    local_38.mousePos.x = 0.0;
    local_38.mousePos.y = 0.0;
    local_38.mouseWheelX = 0.0;
    local_38.mouseWheelY = 0.0;
    goto LAB_00106f84;
  default:
    puts("Unknown input event");
    return;
  }
  local_38.type = EMouseButton;
  local_38.key = 0x285;
LAB_00106f7a:
  local_38.mousePos.x = event->mouse_x;
  local_38.mousePos.y = event->mouse_y;
  local_38.mouseWheelX = 0.0;
  local_38.mouseWheelY = 0.0;
LAB_00106f84:
  std::vector<State::InputEvent,_std::allocator<State::InputEvent>_>::
  emplace_back<State::InputEvent>(&this->inputEvents,&local_38);
  return;
}

Assistant:

void State::handle(ImGuiWS::Event && event) {
    switch (event.type) {
        case ImGuiWS::Event::Connected:
            {
                clients[event.clientId].ip = event.ip;
            }
            break;
        case ImGuiWS::Event::Disconnected:
            {
                clients.erase(event.clientId);
            }
            break;
        case ImGuiWS::Event::MouseMove:
            {
                if (event.clientId == curIdControl) {
                    inputEvents.push_back(InputEvent { InputEvent::Type::EMousePos, false, ImGuiKey_COUNT, -1, { event.mouse_x, event.mouse_y }, 0.0f, 0.0f });
                }
            }
            break;
        case ImGuiWS::Event::MouseDown:
            {
                if (event.clientId == curIdControl) {
                    // map the JS button code to Dear ImGui's button code
                    ImGuiMouseButton butImGui = event.mouse_but;
                    switch (event.mouse_but) {
                        case 1: butImGui = ImGuiMouseButton_Middle; break;
                        case 2: butImGui = ImGuiMouseButton_Right; break;
                    }

                    inputEvents.push_back(InputEvent { InputEvent::Type::EMouseButton, true, ImGuiKey_COUNT, butImGui, { event.mouse_x, event.mouse_y }, 0.0f, 0.0f });
                }
            }
            break;
        case ImGuiWS::Event::MouseUp:
            {
                if (event.clientId == curIdControl) {
                    // map the JS button code to Dear ImGui's button code
                    ImGuiMouseButton butImGui = event.mouse_but;
                    switch (event.mouse_but) {
                        case 1: butImGui = ImGuiMouseButton_Middle; break;
                        case 2: butImGui = ImGuiMouseButton_Right; break;
                    }

                    inputEvents.push_back(InputEvent { InputEvent::Type::EMouseButton, false, ImGuiKey_COUNT, butImGui, { event.mouse_x, event.mouse_y }, 0.0f, 0.0f });
                }
            }
            break;
        case ImGuiWS::Event::MouseWheel:
            {
                if (event.clientId == curIdControl) {
                    inputEvents.push_back(InputEvent { InputEvent::Type::EMouseWheel, false, ImGuiKey_COUNT, -1, { }, event.wheel_x, event.wheel_y });
                }
            }
            break;
        case ImGuiWS::Event::KeyUp:
            {
                if (event.clientId == curIdControl) {
                    if (event.key > 0) {
                        ImGuiKey keyImGui = ::toImGuiKey(event.key);
                        inputEvents.push_back(InputEvent { InputEvent::Type::EKey, false, keyImGui, -1, { }, 0.0f, 0.0f });
                    }
                }
            }
            break;
        case ImGuiWS::Event::KeyDown:
            {
                if (event.clientId == curIdControl) {
                    if (event.key > 0) {
                        ImGuiKey keyImGui = ::toImGuiKey(event.key);
                        inputEvents.push_back(InputEvent { InputEvent::Type::EKey, true, keyImGui, -1, { }, 0.0f, 0.0f });
                    }
                }
            }
            break;
        case ImGuiWS::Event::KeyPress:
            {
                if (event.clientId == curIdControl) {
                    lastAddText.resize(1);
                    lastAddText[0] = event.key;
                }
            }
            break;
        default:
            {
                printf("Unknown input event\n");
            }
    }
}